

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O0

string_view slang::parsing::LexerFacts::getDirectiveText(SyntaxKind kind)

{
  string_view sVar1;
  int in_EDI;
  undefined4 unaff_retaddr;
  undefined8 local_10;
  char *in_stack_fffffffffffffff8;
  
  if (in_EDI == 0x27) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x42) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x83) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x8a) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xa7) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xaa) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xb4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xb5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xb6) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xe7) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xe9) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0xf9) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x111) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x148) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x174) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x193) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x1cf) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x1f7) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x1f8) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else if (in_EDI == 0x1f9) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(kind,unaff_retaddr),
               in_stack_fffffffffffffff8);
  }
  sVar1._M_str = in_stack_fffffffffffffff8;
  sVar1._M_len = local_10;
  return sVar1;
}

Assistant:

std::string_view LexerFacts::getDirectiveText(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective: return "`begin_keywords";
        case SyntaxKind::CellDefineDirective: return "`celldefine";
        case SyntaxKind::DefaultNetTypeDirective: return "`default_nettype";
        case SyntaxKind::DefineDirective: return "`define";
        case SyntaxKind::ElseDirective: return "`else";
        case SyntaxKind::ElsIfDirective: return "`elsif";
        case SyntaxKind::EndKeywordsDirective: return "`end_keywords";
        case SyntaxKind::EndCellDefineDirective: return "`endcelldefine";
        case SyntaxKind::EndIfDirective: return "`endif";
        case SyntaxKind::IfDefDirective: return "`ifdef";
        case SyntaxKind::IfNDefDirective: return "`ifndef";
        case SyntaxKind::IncludeDirective: return "`include";
        case SyntaxKind::LineDirective: return "`line";
        case SyntaxKind::NoUnconnectedDriveDirective: return "`nounconnected_drive";
        case SyntaxKind::PragmaDirective: return "`pragma";
        case SyntaxKind::ResetAllDirective: return "`resetall";
        case SyntaxKind::TimeScaleDirective: return "`timescale";
        case SyntaxKind::UnconnectedDriveDirective: return "`unconnected_drive";
        case SyntaxKind::UndefDirective: return "`undef";
        case SyntaxKind::UndefineAllDirective: return "`undefineall";
        default: return "";
    }
}